

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_ftp.c
# Opt level: O0

int32_t ll_ftp_segment_process_msg(ll_ftp_t *f,uint8_t *buf,uint8_t len)

{
  _Bool _Var1;
  uint16_t uVar2;
  int32_t iVar3;
  undefined1 local_70 [6];
  uint16_t len_2;
  time time_now;
  ll_ftp_state_t local_58;
  ll_ftp_return_code_t lStack_54;
  uint16_t len_1;
  int32_t next_state;
  int32_t ret;
  ll_ftp_msg_t ftp_msg;
  ll_ftp_return_code_t msg_ret;
  uint8_t len_local;
  uint8_t *buf_local;
  ll_ftp_t *f_local;
  
  ftp_msg.payload._7_1_ = len;
  f_local._4_4_ = ll_ftp_parse_rx_msg(buf,len,(ll_ftp_msg_t *)&next_state);
  if (f_local._4_4_ == LL_FTP_OK) {
    local_58 = ~IDLE;
    lStack_54 = LL_FTP_NO_ACTION;
    if ((ftp_msg.file_version == 0) && ((ret != f->file_id || (ftp_msg.crc != f->file_version)))) {
      local_58 = SEGMENT;
    }
    else if ((ftp_msg.file_version == 1) &&
            ((ret == f->file_id && (ftp_msg.crc == f->file_version)))) {
      local_58 = IDLE;
    }
    else if (ftp_msg.file_version == 3) {
      if ((ret == f->file_id) && (ftp_msg.crc == f->file_version)) {
        ll_ftp_reset(f);
        lStack_54 = ll_ftp_write_segment(f,(ll_ftp_msg_t *)&next_state);
        _Var1 = ll_ftp_transfer_is_complete(f);
        if (_Var1) {
          iVar3 = ll_ftp_verify_file(f);
          if (iVar3 == 0) {
            local_58 = APPLY;
          }
          else {
            memset(f->rx_segs,0,0x4cc);
            ll_ftp_reset(f);
            lStack_54 = ll_ftp_file_reopen(f);
            if (lStack_54 != LL_FTP_OK) {
              local_58 = IDLE;
            }
          }
        }
      }
      else {
        local_58 = SEGMENT;
      }
    }
    else if (ftp_msg.file_version == 2) {
      time_now.tv_nsec._6_2_ = ll_ftp_ack_segs_request_generate(f);
      lStack_54 = LL_FTP_OK;
      ftp_msg.payload._0_4_ = ll_ftp_send_uplink(f,(ulong)time_now.tv_nsec._6_2_);
      if ((ll_ftp_return_code_t)ftp_msg.payload != LL_FTP_OK) {
        lStack_54 = LL_FTP_ERROR;
      }
    }
    else if (ftp_msg.file_version == 7) {
      lStack_54 = LL_FTP_OK;
      gettime((time *)local_70);
      iVar3 = ll_difftime(&f->time_last_msg,(time *)local_70);
      if (0xf < iVar3) {
        if (f->retry_count < 5) {
          uVar2 = ll_ftp_ack_segs_request_generate(f);
          ftp_msg.payload._0_4_ = ll_ftp_send_uplink(f,(ulong)uVar2);
          if ((ll_ftp_return_code_t)ftp_msg.payload != LL_FTP_OK) {
            lStack_54 = LL_FTP_ERROR;
          }
          f->retry_count = f->retry_count + '\x01';
        }
        else {
          local_58 = IDLE;
        }
      }
    }
    if (-1 < (int)local_58) {
      lStack_54 = ll_ftp_transition_out_of_segment(f,(ll_ftp_msg_t *)&next_state,local_58);
    }
    f_local._4_4_ = lStack_54;
  }
  return f_local._4_4_;
}

Assistant:

static int32_t ll_ftp_segment_process_msg(ll_ftp_t* f, uint8_t* buf, uint8_t len)
{
    ll_ftp_return_code_t msg_ret;
    ll_ftp_msg_t ftp_msg;
    int32_t ret = ll_ftp_parse_rx_msg(buf, len, &ftp_msg);
    if(LL_FTP_OK != ret)
    {
        return ret;
    }

    int32_t next_state = -1;

    ret = LL_FTP_NO_ACTION; //default value
    if((TX_INIT == ftp_msg.msg_type) && !(IS_MY_FILE))
    {
        next_state = SEGMENT;
    }
    else if ((TX_CANCEL == ftp_msg.msg_type) && (IS_MY_FILE))
    {
        next_state = IDLE;
    }
    else if (TX_SEGMENT == ftp_msg.msg_type)
    {
        if(!(IS_MY_FILE))
        {
            next_state = SEGMENT; // attempt to restart SEGMENT state
        }
        else
        {
            // reset retry and timeout counters
            ll_ftp_reset(f);

            ret = ll_ftp_write_segment(f, &ftp_msg);
            if(ll_ftp_transfer_is_complete(f))
            {
                if(LL_FTP_OK == ll_ftp_verify_file(f))
                {
                    next_state = APPLY;
                }
                else
                {
                    //keep file transfer, but clear file progress and request all segs
                    memset(f->rx_segs, 0, sizeof(f->rx_segs[0]) * NUM_RX_SEGS_BITMASK);
                    ll_ftp_reset(f);

                    ret = ll_ftp_file_reopen(f);
                    if (LL_FTP_OK != ret)
                    {
                        next_state = IDLE;
                    }
                }
            }
        }
    }
    else if (TX_APPLY == ftp_msg.msg_type)
    {
        // Only able to apply in APPLY state
        // send NAK with retry segs
        uint16_t len = ll_ftp_ack_segs_request_generate(f);
        
        ret = LL_FTP_OK;
        msg_ret = ll_ftp_send_uplink(f, len);
        if (msg_ret != LL_FTP_OK)
        {
            ret = LL_FTP_ERROR;
        }
    }
    else if(TICK == ftp_msg.msg_type)
    {
        struct time time_now;
        ret = LL_FTP_OK;

        // Rely on a periodic 1 Hz tick to request segments if necessary
        gettime(&time_now);
        if(ll_difftime(&f->time_last_msg, &time_now) >= LL_FTP_RETRY_INTERVAL)
        {
            if(f->retry_count < LL_FTP_MAX_NUM_RETRIES)
            {
                uint16_t len = ll_ftp_ack_segs_request_generate(f);
                msg_ret = ll_ftp_send_uplink(f, len);
                if (msg_ret != LL_FTP_OK)
                {
                    ret = LL_FTP_ERROR;
                }
        
                f->retry_count++;
            }
            else
            {
                next_state = IDLE;
            }
        }
    }

    // Do state transitions out of SEGMENT
    if(next_state > -1)
    {
        ret = ll_ftp_transition_out_of_segment(f, &ftp_msg, next_state);
    }

    return ret;
}